

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O0

duckdb_state duckdb_append_default(duckdb_appender appender)

{
  long in_RDI;
  ErrorData error;
  exception *ex;
  AppenderWrapper *appender_instance;
  unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>
  *in_stack_ffffffffffffff40;
  Appender *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (in_RDI != 0) {
    duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::operator->
              (in_stack_ffffffffffffff40);
    duckdb::Appender::AppendDefault(in_stack_ffffffffffffffd0);
  }
  local_4 = (duckdb_state)(in_RDI == 0);
  return local_4;
}

Assistant:

duckdb_state duckdb_append_default(duckdb_appender appender) {
	if (!appender) {
		return DuckDBError;
	}
	auto *appender_instance = reinterpret_cast<AppenderWrapper *>(appender);

	try {
		appender_instance->appender->AppendDefault();
	} catch (std::exception &ex) {
		ErrorData error(ex);
		appender_instance->error = error.RawMessage();
		return DuckDBError;
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}